

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O1

void avro::compileJsonSchema(istream *is,ValidSchema *schema)

{
  element_type *peVar1;
  shared_count sVar2;
  Node *__tmp;
  undefined8 *puVar3;
  element_type *local_58;
  shared_count sStack_50;
  undefined1 local_48 [24];
  element_type *local_30;
  shared_count sStack_28;
  
  if (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0) {
    istreamInputStream((avro *)&local_58,is,0x2000);
    compileJsonSchemaFromStream((avro *)&local_30,(InputStream *)local_58);
    if (local_58 != (element_type *)0x0) {
      (*local_58->_vptr_Node[1])();
    }
    sVar2.pi_ = sStack_28.pi_;
    peVar1 = local_30;
    local_30 = (element_type *)0x0;
    sStack_28.pi_ = (sp_counted_base *)0x0;
    local_58 = (schema->root_).px;
    sStack_50.pi_ = (schema->root_).pn.pi_;
    (schema->root_).px = peVar1;
    (schema->root_).pn.pi_ = sVar2.pi_;
    boost::detail::shared_count::~shared_count(&sStack_50);
    boost::detail::shared_count::~shared_count(&sStack_28);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_58 = (element_type *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Input stream is not good","")
  ;
  std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),(string *)&local_58);
  *puVar3 = 0x1917f0;
  puVar3[1] = 0x191820;
  __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

AVRO_DECL void compileJsonSchema(std::istream &is, ValidSchema &schema)
{
    if (!is.good()) {
        throw Exception("Input stream is not good");
    }

    schema = compile(is);
}